

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlParserCtxtPtr htmlNewSAXParserCtxt(htmlSAXHandler *sax,void *userData)

{
  int iVar1;
  xmlParserCtxtPtr ctxt;
  void *userData_local;
  htmlSAXHandler *sax_local;
  
  sax_local = (htmlSAXHandler *)(*xmlMalloc)(0x2f0);
  if ((htmlParserCtxtPtr)sax_local == (htmlParserCtxtPtr)0x0) {
    htmlErrMemory((xmlParserCtxtPtr)0x0,"NewParserCtxt: out of memory\n");
    sax_local = (htmlSAXHandler *)0x0;
  }
  else {
    memset(sax_local,0,0x2f0);
    iVar1 = htmlInitParserCtxt((htmlParserCtxtPtr)sax_local,sax,userData);
    if (iVar1 < 0) {
      htmlFreeParserCtxt((htmlParserCtxtPtr)sax_local);
      sax_local = (htmlSAXHandler *)0x0;
    }
  }
  return (htmlParserCtxtPtr)sax_local;
}

Assistant:

htmlParserCtxtPtr
htmlNewSAXParserCtxt(const htmlSAXHandler *sax, void *userData)
{
    xmlParserCtxtPtr ctxt;

    ctxt = (xmlParserCtxtPtr) xmlMalloc(sizeof(xmlParserCtxt));
    if (ctxt == NULL) {
        htmlErrMemory(NULL, "NewParserCtxt: out of memory\n");
	return(NULL);
    }
    memset(ctxt, 0, sizeof(xmlParserCtxt));
    if (htmlInitParserCtxt(ctxt, sax, userData) < 0) {
        htmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    return(ctxt);
}